

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O0

string * FormatISO8601Date_abi_cxx11_(int64_t nTime)

{
  month mVar1;
  day dVar2;
  year yVar3;
  uint uVar4;
  uint uVar5;
  string *in_RDI;
  long in_FS_OFFSET;
  year_month_day ymd;
  enable_if_t<__is_duration<duration<long,_ratio<86400L>_>_>::value,_time_point<system_clock,_duration<long,_ratio<86400L,_1L>_>_>_>
  days;
  sys_seconds secs;
  year_month_day *this;
  year_month_day *this_00;
  string *args_2;
  undefined7 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar6;
  undefined2 in_stack_ffffffffffffffcc;
  year_month_day local_20 [2];
  year_month_day local_18 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = local_20;
  args_2 = in_RDI;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
            ((duration<long,_std::ratio<1L,_1L>_> *)in_RDI,(long *)0x1b04520);
  this_00 = local_18;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::
  time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
              *)in_RDI,(duration *)0x1b04534);
  std::chrono::
  floor<std::chrono::duration<long,std::ratio<86400l,1l>>,std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1l>>>
            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
              *)this);
  std::chrono::year_month_day::year_month_day(this_00,(sys_days *)this);
  yVar3 = std::chrono::year_month_day::year(this);
  std::chrono::year::operator_cast_to_int((year *)in_RDI);
  mVar1 = std::chrono::year_month_day::month(this);
  uVar6 = CONCAT13(mVar1._M_m,(int3)in_stack_ffffffffffffffc4);
  uVar4 = std::chrono::month::operator_cast_to_unsigned_int((month *)in_RDI);
  dVar2 = std::chrono::year_month_day::day(this);
  uVar5 = std::chrono::day::operator_cast_to_unsigned_int((day *)in_RDI);
  tinyformat::format<int,unsigned_int,unsigned_int>
            ((char *)CONCAT26(yVar3._M_y,CONCAT24(in_stack_ffffffffffffffcc,uVar4)),
             (int *)CONCAT44(uVar6,uVar5),(uint *)CONCAT17(dVar2._M_d,in_stack_ffffffffffffffb8),
             (uint *)args_2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string FormatISO8601Date(int64_t nTime)
{
    const std::chrono::sys_seconds secs{std::chrono::seconds{nTime}};
    const auto days{std::chrono::floor<std::chrono::days>(secs)};
    const std::chrono::year_month_day ymd{days};
    return strprintf("%04i-%02u-%02u", signed{ymd.year()}, unsigned{ymd.month()}, unsigned{ymd.day()});
}